

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

Address * __thiscall
cfd::ConfidentialTransactionContext::GetTxOutPegoutAddress
          (Address *__return_storage_ptr__,ConfidentialTransactionContext *this,uint32_t index,
          NetType mainchain_network)

{
  pointer pCVar1;
  long lVar2;
  CfdException *this_00;
  allocator local_51;
  Script local_50;
  
  pCVar1 = (this->super_ConfidentialTransaction).vout_.
           super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->super_ConfidentialTransaction).vout_.
                super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1;
  if ((ulong)index < (ulong)(lVar2 / 0xf8)) {
    core::AbstractTxOut::GetLockingScript(&local_50,&pCVar1[index].super_AbstractTxOut);
    core::Address::GetPegoutAddress(__return_storage_ptr__,mainchain_network,&local_50);
    core::Script::~Script(&local_50);
    return __return_storage_ptr__;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30,pCVar1,lVar2 % 0xf8);
  std::__cxx11::string::string((string *)&local_50,"vout out_of_range error.",&local_51);
  core::CfdException::CfdException(this_00,kCfdOutOfRangeError,(string *)&local_50);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

Address ConfidentialTransactionContext::GetTxOutPegoutAddress(
    uint32_t index, NetType mainchain_network) const {
  if (vout_.size() <= index) {
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "vout out_of_range error.");
  }
  return Address::GetPegoutAddress(
      mainchain_network, vout_[index].GetLockingScript());
}